

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O1

void __thiscall CTPNStmBreak::gen_code(CTPNStmBreak *this,int param_1,int param_2)

{
  CTPNStmEnclosing *pCVar1;
  int iVar2;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  pCVar1 = G_cs->enclosing_;
  if (pCVar1 != (CTPNStmEnclosing *)0x0) {
    iVar2 = (*(pCVar1->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
              _vptr_CTcPrsNodeBase[0x1f])
                      (pCVar1,(this->super_CTPNStmBreakBase).lbl_,
                       (this->super_CTPNStmBreakBase).lbl_len_);
    if (iVar2 != 0) {
      return;
    }
  }
  if ((this->super_CTPNStmBreakBase).lbl_ != (textchar_t *)0x0) {
    CTcTokenizer::log_error(0x2d08,(ulong)(uint)(this->super_CTPNStmBreakBase).lbl_len_);
    return;
  }
  CTcTokenizer::log_error(0x2d03);
  return;
}

Assistant:

void CTPNStmBreak::gen_code(int, int)
{
    /* add a line record */
    add_debug_line_rec();

    /* 
     *   ask the enclosing statement to do the work - if there's no
     *   enclosing statement, or none of the enclosing statements can
     *   perform the break, it's an error 
     */
    if (G_cs->get_enclosing() == 0
        || !G_cs->get_enclosing()->gen_code_break(lbl_, lbl_len_))
    {
        /* 
         *   log the error - if there's a label, the problem is that we
         *   couldn't find the label, otherwise it's that we can't perform
         *   a 'break' here at all 
         */
        if (lbl_ == 0)
            G_tok->log_error(TCERR_INVALID_BREAK);
        else
            G_tok->log_error(TCERR_INVALID_BREAK_LBL, (int)lbl_len_, lbl_);
    }
}